

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O3

rational<int> tcb::operator-(rational<char> *lhs,rational<char> *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = (int)lhs->num_ * (int)rhs->denom_ - (int)rhs->num_ * (int)lhs->denom_;
  uVar5 = (int)lhs->denom_ * (int)rhs->denom_;
  uVar2 = uVar3;
  uVar1 = uVar5;
  while (uVar1 != 0) {
    uVar4 = (int)uVar2 % (int)uVar1;
    uVar2 = uVar1;
    uVar1 = uVar4;
  }
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = -uVar3;
  if (-1 < (int)uVar5) {
    uVar2 = uVar3;
  }
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  return (rational<int>)
         ((ulong)uVar3 / (ulong)uVar1 << 0x20 | (long)(int)uVar2 / (long)(int)uVar1 & 0xffffffffU);
}

Assistant:

constexpr value_type num() const { return num_; }